

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk80(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk80 *peVar4;
  envy_bios_power_unk80_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk80 *unk80;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk80;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk80.version);
    if ((bios->power).unk80.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk80.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk80.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk80.entriesnum);
      (bios->power).unk80.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk80_entry *)malloc((ulong)(bios->power).unk80.entriesnum << 2);
      (bios->power).unk80.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk80.entriesnum; data = data + 1) {
        (bios->power).unk80.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk80.hlen + data * (bios->power).unk80.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER GR table version 0x%x\n",(ulong)(bios->power).unk80.version
             );
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk80(struct envy_bios *bios) {
	struct envy_bios_power_unk80 *unk80 = &bios->power.unk80;
	int i, err = 0;

	if (!unk80->offset)
		return -EINVAL;

	bios_u8(bios, unk80->offset + 0x0, &unk80->version);
	switch(unk80->version) {
	case 0x10:
		err |= bios_u8(bios, unk80->offset + 0x1, &unk80->hlen);
		err |= bios_u8(bios, unk80->offset + 0x2, &unk80->rlen);
		err |= bios_u8(bios, unk80->offset + 0x3, &unk80->entriesnum);
		unk80->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER GR table version 0x%x\n", unk80->version);
		return -EINVAL;
	};

	err = 0;
	unk80->entries = malloc(unk80->entriesnum * sizeof(struct envy_bios_power_unk80_entry));
	for (i = 0; i < unk80->entriesnum; i++) {
		uint32_t data = unk80->offset + unk80->hlen + i * unk80->rlen;

		unk80->entries[i].offset = data;
	}

	return 0;
}